

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O3

int set_paramptr(FILE *paramfile)

{
  rpf_t **pprVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  rpf_t *prVar8;
  undefined *puVar9;
  bool bVar10;
  undefined1 *__dest;
  ulong uVar11;
  long lVar12;
  char cVar13;
  char *__s;
  double (*padVar14) [16];
  int (*paiVar15) [16];
  char *pcVar16;
  long lVar17;
  int iVar18;
  char *__s_00;
  long lVar19;
  undefined1 uVar20;
  double dVar21;
  undefined1 auVar22 [16];
  char name [32];
  char value_str [100];
  char param_names [73] [20];
  variables_t variables [257];
  char variable_names [37] [20];
  char param_names1 [73] [24];
  char param_names0 [73] [24];
  char *local_2750;
  char *local_2740;
  char local_2738 [32];
  char local_2718 [112];
  char local_26a8 [300];
  undefined1 local_257c [1156];
  long alStack_20f8 [440];
  OdometryPtr ap_Stack_1338 [2];
  long lStack_1328;
  double *local_1320;
  double *local_1310;
  double *local_1300;
  double *local_12f0;
  long alStack_12e0 [32];
  long alStack_11e0 [31];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [752];
  char local_de8 [1760];
  char local_708 [1752];
  
  pcVar16 = local_26a8;
  memcpy(pcVar16,"VERSION",0x5b4);
  memcpy(local_708,"VERSION",0x6d8);
  memcpy(local_de8,"VERSION",0x6d8);
  __dest = local_10d8;
  memcpy(__dest,&DAT_00116330,0x2e4);
  padVar14 = g_P;
  lVar12 = 0;
  do {
    __s_00 = local_708 + lVar12;
    sVar7 = strlen(__s_00);
    builtin_strncpy(local_708 + sVar7 + lVar12,"[0]",4);
    __s = local_de8 + lVar12;
    sVar7 = strlen(__s);
    builtin_strncpy(local_de8 + sVar7 + lVar12,"[1]",4);
    *(char **)((long)alStack_20f8 + lVar12 * 2 + 0x10) = pcVar16;
    *(double (**) [16])((long)alStack_20f8 + lVar12 * 2 + 0x18) = padVar14;
    *(char **)((long)alStack_20f8 + lVar12 * 2 + 0x20) = __s_00;
    *(double (**) [16])((long)alStack_20f8 + lVar12 * 2 + 0x28) = padVar14;
    *(char **)((long)alStack_20f8 + lVar12 * 2 + 0x30) = __s;
    *(double **)((long)alStack_20f8 + lVar12 * 2 + 0x38) = *padVar14 + 1;
    lVar12 = lVar12 + 0x18;
    padVar14 = padVar14 + 1;
    pcVar16 = pcVar16 + 0x14;
  } while (lVar12 != 0x6d8);
  lVar12 = 0xdc0;
  auVar22 = _DAT_00111020;
  do {
    if (SUB164(auVar22 ^ _DAT_00112760,4) == -0x80000000 &&
        SUB164(auVar22 ^ _DAT_00112760,0) < -0x7fffffdb) {
      *(undefined1 **)((long)alStack_20f8 + lVar12) = __dest;
      *(undefined1 **)((long)alStack_20f8 + lVar12 + 0x10) = __dest + 0x14;
    }
    lVar17 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 2;
    auVar22._8_8_ = lVar17 + 2;
    lVar12 = lVar12 + 0x20;
    __dest = __dest + 0x28;
  } while (lVar12 != 0x1020);
  lVar12 = 0;
  ap_Stack_1338[1] = get_odometry_ptr();
  local_1320 = &ap_Stack_1338[1]->y;
  local_1310 = &ap_Stack_1338[1]->theta;
  local_1300 = &ap_Stack_1338[1]->v;
  local_12f0 = &ap_Stack_1338[1]->w;
  do {
    *(long *)((long)alStack_12e0 + lVar12 * 2) = (long)ap_Stack_1338[1]->wvel + lVar12;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x80);
  lVar12 = 0;
  do {
    *(long *)((long)alStack_11e0 + lVar12 * 2) = (long)ap_Stack_1338[1]->wang + lVar12;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x80);
  local_10e8 = (undefined1  [16])0x0;
  memset(g_P_changed,0,0x1240);
  if (g_param_init != 0) {
    g_param.motor_enable[0xc] = 0;
    g_param.motor_enable[0xd] = 0;
    g_param.motor_enable[0xe] = 0;
    g_param.motor_enable[0xf] = 0;
    g_param.motor_enable[8] = 0;
    g_param.motor_enable[9] = 0;
    g_param.motor_enable[10] = 0;
    g_param.motor_enable[0xb] = 0;
    g_param.motor_enable[4] = 0;
    g_param.motor_enable[5] = 0;
    g_param.motor_enable[6] = 0;
    g_param.motor_enable[7] = 0;
    g_param.motor_enable[0] = 0;
    g_param.motor_enable[1] = 0;
    g_param.motor_enable[2] = 0;
    g_param.motor_enable[3] = 0;
    lVar12 = 0;
    do {
      (g_P_changed[3] + lVar12)[0] = 1;
      (g_P_changed[3] + lVar12)[1] = 1;
      (g_P_changed[3] + lVar12 + 2)[0] = 1;
      (g_P_changed[3] + lVar12 + 2)[1] = 1;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x10);
    memset(g_P,0,0x2480);
    memset(g_P_set,0,0x1240);
    memset(g_Pf,0,0x2480);
  }
  uVar11 = 0x49;
  paiVar15 = g_P_set;
  sVar7 = 0;
  uVar20 = 0;
  uVar5 = 0;
  bVar3 = false;
LAB_0010c885:
  do {
    uVar4 = getc((FILE *)paramfile);
    uVar2 = uVar4;
    if (uVar4 == 0xffffffff) {
      uVar2 = 10;
    }
    cVar13 = (char)uVar2;
    iVar18 = (int)sVar7;
    iVar6 = (int)uVar11;
    switch(uVar20) {
    case 0:
      if (uVar2 != 0x23) {
        bVar10 = uVar2 == 0x5f || (uVar2 & 0xffffffdf) - 0x41 < 0x1a;
      }
      else {
        bVar10 = false;
      }
      uVar20 = uVar2 == 0x23;
      if ((uVar2 == 0x2d) || (bVar10)) {
        uVar20 = 2;
        sVar7 = 1;
        local_2738[0] = cVar13;
      }
      break;
    case 1:
      uVar20 = uVar2 != 10;
      break;
    case 2:
      local_2738[iVar18] = cVar13;
      if ((((uVar2 == 0x5f) || (0xffffffe5 < (uVar2 & 0xffffffdf) - 0x5b)) ||
          (uVar2 - 0x2d < 2 || uVar2 - 0x30 < 10)) ||
         ((uVar4 - 0x2d < 0x31 && ((0x1400000000001U >> ((ulong)(uVar4 - 0x2d) & 0x3f) & 1) != 0))))
      {
        sVar7 = (size_t)(iVar18 + 1);
        uVar20 = 2;
      }
      else {
        local_2738[iVar18] = '\0';
        uVar20 = 3;
        sVar7 = 0;
      }
      break;
    case 3:
      if (uVar2 - 0x3a < 0xfffffff6 && uVar2 - 0x2f < 0xfffffffe) {
        uVar20 = 3;
        if (uVar2 != 0x3d) break;
        strcpy(local_2718,local_2738);
        sVar7 = strlen(local_2718);
        (local_2718 + sVar7)[0] = '=';
        (local_2718 + sVar7)[1] = '\0';
        sVar7 = strlen(local_2718);
        uVar20 = 5;
      }
      else {
        uVar20 = 4;
        sVar7 = 1;
        local_2718[0] = cVar13;
      }
      pcVar16 = strchr(local_2738,0x5b);
      if (pcVar16 == (char *)0x0) {
        uVar5 = 0xffffffff;
        local_2740 = (char *)0x0;
        local_2750 = (char *)0x0;
      }
      else {
        local_2750 = strchr(local_2738,0x5d);
        if (local_2750 == (char *)0x0) {
          yprintf(OUTPUT_LV_ERROR,"Error: Invalid parameter -- \'%s\'.\n",local_2738);
          bVar3 = true;
          uVar20 = 4;
          uVar11 = 0x49;
          goto LAB_0010c885;
        }
        local_2740 = pcVar16 + 1;
        *pcVar16 = '\0';
        *local_2750 = '\0';
        uVar5 = atoi(local_2740);
      }
      pcVar16 = local_26a8;
      uVar11 = 0;
      do {
        iVar6 = strcmp(local_2738,pcVar16);
        if (iVar6 == 0) {
          if (uVar11 == 0x10) {
            puVar9 = &DAT_0011662c;
          }
          else {
            puVar9 = &DAT_00116620;
            if (uVar11 != 0x11) goto LAB_0010cf17;
          }
          uVar5 = *(uint *)(puVar9 + 8);
          yprintf(OUTPUT_LV_WARNING,"Parameter alias: %s -> %s[%d]\n",pcVar16,local_257c);
          uVar11 = 0xf;
          goto LAB_0010cf17;
        }
        uVar11 = uVar11 + 1;
        pcVar16 = pcVar16 + 0x14;
      } while (uVar11 != 0x49);
      uVar11 = 0x49;
LAB_0010cf17:
      if (local_2740 != (char *)0x0) {
        local_2740[-1] = '[';
        *local_2750 = ']';
      }
      break;
    case 4:
      if (0xfffffffd < uVar2 - 0x2f || 0xfffffff5 < uVar2 - 0x3a) {
        local_2718[iVar18] = cVar13;
        uVar20 = 4;
        sVar7 = (size_t)(iVar18 + 1);
        break;
      }
      local_2718[iVar18] = '\0';
      if (iVar6 == 0x49) {
        yprintf(OUTPUT_LV_ERROR,"Error: Invalid parameter -- \'%s\'.\n",local_2738);
        bVar3 = true;
      }
      else {
        if (uVar5 != 0xffffffff) {
          dVar21 = strtod(local_2718,(char **)0x0);
          lVar12 = (long)iVar6;
          g_P[lVar12][(int)uVar5] = dVar21;
          g_P_set[lVar12][(int)uVar5] = 1;
          g_P_changed[lVar12][(int)uVar5] = 1;
          g_param.motor_enable[(int)uVar5] = 1;
          if (g_Pf[lVar12][(int)uVar5] != (rpf_t *)0x0) {
            formula_free();
            g_Pf[lVar12][(int)uVar5] = (rpf_t *)0x0;
            dVar21 = g_P[lVar12][(int)uVar5];
          }
          yprintf(OUTPUT_LV_DEBUG,"%d %s[%d] %f\n",dVar21,uVar11 & 0xffffffff,
                  local_26a8 + lVar12 * 0x14,(ulong)uVar5);
          goto joined_r0x0010ca62;
        }
        lVar12 = (long)iVar6;
        lVar17 = 0;
        do {
          dVar21 = strtod(local_2718,(char **)0x0);
          *(double *)((long)g_P[lVar12] + lVar17 * 2) = dVar21;
          *(undefined4 *)((long)g_P_set[lVar12] + lVar17) = 1;
          *(undefined4 *)((long)g_P_changed[lVar12] + lVar17) = 1;
          if (*(long *)((long)g_Pf[lVar12] + lVar17 * 2) != 0) {
            formula_free();
            *(undefined8 *)((long)g_Pf[lVar12] + lVar17 * 2) = 0;
          }
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x40);
        yprintf(OUTPUT_LV_DEBUG,"%d %s %f\n",g_P[lVar12][0],uVar11 & 0xffffffff,
                local_26a8 + lVar12 * 0x14);
LAB_0010d010:
        uVar5 = 0xffffffff;
      }
      sVar7 = 0;
      uVar20 = 0;
      uVar11 = 0x49;
      goto joined_r0x0010ca62;
    case 5:
      if ((uVar2 == 0x23) || (uVar2 == 10)) {
        local_2718[iVar18] = '\0';
        if (iVar6 == 0x49) {
          yprintf(OUTPUT_LV_ERROR,"Error: Invalid parameter -- \'%s\'.\n",local_2738);
        }
        else {
          lVar12 = (long)iVar6;
          if (uVar5 != 0xffffffff) {
            g_P[lVar12][(int)uVar5] = 0.0;
            g_P_set[lVar12][(int)uVar5] = 1;
            if (g_Pf[lVar12][(int)uVar5] != (rpf_t *)0x0) {
              formula_free();
            }
            pprVar1 = g_Pf[lVar12] + (int)uVar5;
            formula(local_2718,pprVar1,alStack_20f8 + 2);
            if (*pprVar1 == (rpf_t *)0x0) {
              yprintf(OUTPUT_LV_ERROR,"Error: Invalid formula -- \'%s\'.\n",local_2718);
              bVar3 = true;
            }
            else {
              prVar8 = (rpf_t *)formula_optimize();
              *pprVar1 = prVar8;
              yprintf(OUTPUT_LV_DEBUG,"%d %s[%d] ",uVar11 & 0xffffffff,local_26a8 + lVar12 * 0x14,
                      (ulong)uVar5);
              if (OUTPUT_LV_INFO < g_param.output_lv) {
                formula_print(_stderr,*pprVar1);
              }
              yprintf(OUTPUT_LV_DEBUG,"\n");
            }
            goto joined_r0x0010ca62;
          }
          lVar17 = lVar12 * 0x80;
          lVar19 = 0;
          do {
            *(undefined8 *)((long)g_P[0] + lVar17) = 0;
            g_P_set[lVar12][lVar19] = 1;
            if (*(long *)((long)g_Pf[0] + lVar17) != 0) {
              formula_free();
            }
            formula(local_2718,(long)g_Pf[0] + lVar17,alStack_20f8 + 2);
            lVar19 = lVar19 + 1;
            lVar17 = lVar17 + 8;
          } while (lVar19 != 0x10);
          if (g_Pf[lVar12][0] != (rpf_t *)0x0) {
            lVar17 = 0;
            do {
              prVar8 = (rpf_t *)formula_optimize(g_Pf[lVar12][lVar17]);
              g_Pf[lVar12][lVar17] = prVar8;
              lVar17 = lVar17 + 1;
            } while (lVar17 != 0x10);
            yprintf(OUTPUT_LV_DEBUG,"%d %s ",uVar11 & 0xffffffff,local_26a8 + lVar12 * 0x14);
            if (OUTPUT_LV_INFO < g_param.output_lv) {
              formula_print(_stderr,g_Pf[lVar12][0]);
            }
            yprintf(OUTPUT_LV_DEBUG,"\n");
            goto LAB_0010d010;
          }
          yprintf(OUTPUT_LV_ERROR,"Error: Invalid formula -- \'%s\'.\n",local_2718);
          uVar5 = 0xffffffff;
        }
        bVar3 = true;
joined_r0x0010ca62:
        uVar20 = 0;
        sVar7 = 0;
        uVar11 = 0x49;
        goto joined_r0x0010ca62;
      }
      sVar7 = (size_t)(iVar18 + 1);
      local_2718[iVar18] = cVar13;
      uVar20 = 5;
    }
joined_r0x0010ca62:
  } while (uVar4 != 0xffffffff);
  fclose((FILE *)paramfile);
  if (4.0 <= g_P[0][0]) {
    if (g_P[0][0] <= 5.0) {
      lVar12 = 0;
      do {
        uVar11 = 0;
        do {
          if (((g_param.motor_enable[uVar11] != 0) && ((&DAT_00116200)[lVar12] != 0)) &&
             ((*paiVar15)[uVar11] == 0)) {
            yprintf(OUTPUT_LV_ERROR,"Error: %s[%d] undefined!\n",local_26a8 + lVar12 * 0x14,
                    uVar11 & 0xffffffff);
            bVar3 = true;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x10);
        lVar12 = lVar12 + 1;
        paiVar15 = paiVar15 + 1;
      } while (lVar12 != 0x49);
      if (!bVar3) {
        g_param.num_motor_enable = 0;
        lVar12 = 0;
        iVar6 = 0;
        do {
          if (g_param.motor_enable[lVar12] != 0) {
            g_param.num_motor_enable = iVar6 + 1;
            iVar6 = g_param.num_motor_enable;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x10);
        if (iVar6 == 0) {
          g_param.motor_enable[0] = 1;
          g_param.motor_enable[1] = 1;
          g_param.num_motor_enable = 2;
        }
        uVar11 = 0;
        do {
          if (g_param.motor_enable[uVar11] != 0) {
            if ((g_P_changed[0x40][uVar11] != 0) && (g_P_set[0x40][uVar11] != 0)) {
              if (g_P[0][0] < 5.0) {
                pcVar16 = 
                "ERROR: Using ENCODER_DENOMINATOR requires parameter version >= 5.0.\n Please make sure that all other motor parameters are based on mechanical motor revolution instead of electrical.\n"
                ;
                goto LAB_0010d55d;
              }
              yprintf(OUTPUT_LV_WARNING,
                      "Warn: ENCODER_DENOMINATOR parameter support is experimental.\n The behavior of this parameter may be changed in the future update.\n"
                     );
            }
            if (g_P_set[0x27][uVar11] == 0) {
              yprintf(OUTPUT_LV_WARNING,
                      "Warn: TORQUE_LIMIT[%d] undefined. TORQUE_MAX[%d] will be used.\n",
                      uVar11 & 0xffffffff,uVar11 & 0xffffffff);
              g_P[0x27][uVar11] = g_P[0x20][uVar11];
              g_P_changed[0x27][uVar11] = g_P_changed[0x20][uVar11];
            }
            if (g_P_set[0x3b][uVar11] == 0) {
              dVar21 = 1.0;
              if (1 < uVar11) {
                dVar21 = 0.0;
              }
              if ((g_P[0x3b][uVar11] != dVar21) || (NAN(g_P[0x3b][uVar11]) || NAN(dVar21))) {
                g_P_changed[0x3b][uVar11] = 1;
              }
              g_P[0x3b][uVar11] = dVar21;
            }
            if (g_P_set[5][uVar11] == 0) {
              if ((g_P[5][uVar11] != 2.0) || (NAN(g_P[5][uVar11]))) {
                g_P_changed[5][uVar11] = 1;
              }
              g_P[5][uVar11] = 2.0;
            }
            if (g_P_set[0x45][uVar11] == 0) {
              if ((g_P[0x45][uVar11] != 1.0) || (NAN(g_P[0x45][uVar11]))) {
                g_P_changed[0x45][uVar11] = 1;
              }
              g_P[0x45][uVar11] = 1.0;
            }
            if (g_P_set[0x40][uVar11] == 0) {
              if ((g_P[0x40][uVar11] != 1.0) || (NAN(g_P[0x40][uVar11]))) {
                g_P_changed[0x40][uVar11] = 1;
              }
              g_P[0x40][uVar11] = 1.0;
            }
            if (g_P_set[0x46][uVar11] == 0) {
              g_P[0x46][uVar11] = 0.3;
            }
            g_P[1][uVar11] = 1.0 / g_P[2][uVar11];
            g_P_changed[1][uVar11] = g_P_changed[2][uVar11];
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x10);
        if (g_P_set[0x47][0] == 0) {
          g_P[0x47][0] = g_P[0x13][0];
          bVar3 = true;
        }
        else {
          bVar3 = true;
          if (g_P[0x47][0] <= 0.0) {
            bVar3 = false;
            yprintf(OUTPUT_LV_ERROR,"ERROR: MAX_TIME_JUMP must be > 0.0.\n");
          }
        }
        if (g_P_set[0x48][0] == 0) {
          g_P[0x48][0] = g_P[0x13][0];
        }
        else if (g_P[0x48][0] <= 0.0) {
          pcVar16 = "ERROR: -MAX_TIME_JUMP must be > 0.0.\n";
LAB_0010d55d:
          yprintf(OUTPUT_LV_ERROR,pcVar16);
          return 0;
        }
        if (bVar3) {
          calc_param_inertia2ff();
          builtin_strncpy(g_state,"\x01\x01\x01\x01",4);
          yprintf(OUTPUT_LV_DEBUG,"Info: %d motors defined\n",(ulong)(uint)g_param.num_motor_enable)
          ;
          return 1;
        }
      }
      return 0;
    }
    yprintf(OUTPUT_LV_ERROR,"Error: Your parameter file format is unsupported!\n");
    yprintf(OUTPUT_LV_ERROR,"Error: Please install newer version of YP-Spur.\n");
    pcVar16 = "Error: This program supports %3.1f.\n";
  }
  else {
    yprintf(OUTPUT_LV_ERROR,"Error: Your parameter file format is too old!\n");
    pcVar16 = "Error: This program requires %3.1f.\n";
  }
  yprintf(OUTPUT_LV_ERROR,pcVar16);
  return 0;
}

Assistant:

int set_paramptr(FILE* paramfile)
{
  char param_names[YP_PARAM_NUM][20] = YP_PARAM_NAME;
  char param_names0[YP_PARAM_NUM][24] = YP_PARAM_NAME;
  char param_names1[YP_PARAM_NUM][24] = YP_PARAM_NAME;
  int param_necessary[YP_PARAM_NUM] = YP_PARAM_NECESSARY;
#define VARIABLE_NUM 37
  char variable_names[VARIABLE_NUM][20] =
      {
          "X",
          "Y",
          "THETA",
          "V",
          "W",
          "WHEEL_VEL[0]",
          "WHEEL_VEL[1]",
          "WHEEL_VEL[2]",
          "WHEEL_VEL[3]",
          "WHEEL_VEL[4]",
          "WHEEL_VEL[5]",
          "WHEEL_VEL[6]",
          "WHEEL_VEL[7]",
          "WHEEL_VEL[8]",
          "WHEEL_VEL[9]",
          "WHEEL_VEL[10]",
          "WHEEL_VEL[11]",
          "WHEEL_VEL[12]",
          "WHEEL_VEL[13]",
          "WHEEL_VEL[14]",
          "WHEEL_VEL[15]",
          "WHEEL_ANGLE[0]",
          "WHEEL_ANGLE[1]",
          "WHEEL_ANGLE[2]",
          "WHEEL_ANGLE[3]",
          "WHEEL_ANGLE[4]",
          "WHEEL_ANGLE[5]",
          "WHEEL_ANGLE[6]",
          "WHEEL_ANGLE[7]",
          "WHEEL_ANGLE[8]",
          "WHEEL_ANGLE[9]",
          "WHEEL_ANGLE[10]",
          "WHEEL_ANGLE[11]",
          "WHEEL_ANGLE[12]",
          "WHEEL_ANGLE[13]",
          "WHEEL_ANGLE[14]",
          "WHEEL_ANGLE[15]",
      };
  struct variables_t variables[YP_PARAM_NUM * 3 + 1 + VARIABLE_NUM];
  struct
  {
    YPSpur_param alias;
    YPSpur_param param;
    int motor;
  } param_alias[YP_PARAM_ALIAS_NUM] = YP_PARAM_ALIAS;
  char name[32], value_str[100];
  int i, j, c;
  int str_wp;
  int read_state;
  int param_num, motor_num;
  OdometryPtr odm;
  int param_error = 0;

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    strcat(param_names0[i], "[0]");
    strcat(param_names1[i], "[1]");
    variables[i * 3 + 0].name = param_names[i];
    variables[i * 3 + 0].pointer = &g_P[i][0];
    variables[i * 3 + 1].name = param_names0[i];
    variables[i * 3 + 1].pointer = &g_P[i][0];
    variables[i * 3 + 2].name = param_names1[i];
    variables[i * 3 + 2].pointer = &g_P[i][1];
  }
  i = i * 3;
  for (j = 0; j < VARIABLE_NUM; j++)
  {
    variables[i + j].name = variable_names[j];
  }
  odm = get_odometry_ptr();
  variables[i++].pointer = &odm->x;
  variables[i++].pointer = &odm->y;
  variables[i++].pointer = &odm->theta;
  variables[i++].pointer = &odm->v;
  variables[i++].pointer = &odm->w;
  for (j = 0; j < 16; j++)
    variables[i++].pointer = &odm->wvel[j];
  for (j = 0; j < 16; j++)
    variables[i++].pointer = &odm->wang[j];
  variables[i].name = NULL;
  variables[i].pointer = NULL;

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    int j;
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      g_P_changed[i][j] = 0;
    }
  }
  if (g_param_init)
  {
    int j;
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      g_P_changed[YP_PARAM_PWM_MAX][j] = 1;
      g_param.motor_enable[j] = 0;
    }
    // パラメータの初期化
    for (i = 0; i < YP_PARAM_NUM; i++)
    {
      for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
      {
        g_P[i][j] = 0;
        g_P_set[i][j] = 0;
        g_Pf[i][j] = NULL;
      }
    }
  }

  // パラメータファイルの読み込み
  read_state = 0;
  str_wp = 0;
  motor_num = 0;
  param_num = YP_PARAM_NUM;
  while (1)
  {
    int eof = 0;

    c = getc(paramfile);
    if (c == EOF)
    {
      eof = 1;
      c = '\n';
    }

    switch (read_state)
    {
      case 0:
        /* - */
        if (c == '#')
        {
          read_state = 1;
        }
        if (is_character(c) || c == '-')
        {
          name[0] = c;
          read_state = 2;
          str_wp = 1;
        }
        break;
      case 1: /* comment */
        if (c == '\n')
        {
          read_state = 0;
        }
        break;
      case 2: /* name */
        name[str_wp] = c;
        if (!(is_character(c) || is_number(c) || c == '[' || c == ']' || c == '-'))
        {
          name[str_wp] = 0;
          read_state = 3;
          str_wp = 0;
        }
        else
        {
          str_wp++;
        }
        break;
      case 3: /* value */
        if (is_number(c))
        {
          str_wp = 0;
          value_str[str_wp] = c;
          str_wp++;
          read_state = 4;
        }
        else if (c == '=')
        {
          strcpy(value_str, name);
          strcat(value_str, "=");
          str_wp = strlen(value_str);
          read_state = 5;
        }
        if (read_state != 3)
        {
          char* num_start;
          char* num_end = NULL;
          int num;

          param_num = YP_PARAM_NUM;
          num = -1;

          num_start = strchr(name, '[');
          if (num_start)
          {
            num_start++;
            num_end = strchr(name, ']');
            if (!num_end)
            {
              read_state = 4;
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
              param_error = 1;
              continue;
            }
            *(num_start - 1) = 0;
            *num_end = 0;
            num = atoi(num_start);
          }
          motor_num = num;
          for (i = 0; i < YP_PARAM_NUM; i++)
          {
            if (!strcmp(name, param_names[i]))
            {
              int j;
              for (j = 0; j < YP_PARAM_ALIAS_NUM; j++)
              {
                if (i == param_alias[j].alias)
                {
                  yprintf(OUTPUT_LV_WARNING, "Parameter alias: %s -> %s[%d]\n",
                          param_names[i], param_names[param_alias[j].param], param_alias[j].motor);
                  i = param_alias[j].param;
                  motor_num = param_alias[j].motor;
                  break;
                }
              }
              param_num = i;
              break;
            }
          }
          if (num_start)
          {
            *(num_start - 1) = '[';
            *num_end = ']';
          }
        }
        break;
      case 4: /* value */
        if (!is_number(c))
        {
          value_str[str_wp] = 0;
          str_wp = 0;
          if (param_num == YP_PARAM_NUM)
          {
            yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
            param_error = 1;
          }
          else if (motor_num == -1)
          {
            int j;
            for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
            {
              g_P[param_num][j] = strtod(value_str, 0);
              g_P_set[param_num][j] = 1;
              g_P_changed[param_num][j] = 1;
              if (g_Pf[param_num][j])
              {
                formula_free(g_Pf[param_num][j]);
                g_Pf[param_num][j] = NULL;
              }
            }
            yprintf(OUTPUT_LV_DEBUG, "%d %s %f\n", param_num, param_names[param_num], g_P[param_num][0]);
          }
          else
          {
            g_P[param_num][motor_num] = strtod(value_str, 0);
            g_P_set[param_num][motor_num] = 1;
            g_P_changed[param_num][motor_num] = 1;
            g_param.motor_enable[motor_num] = 1;
            if (g_Pf[param_num][motor_num])
            {
              formula_free(g_Pf[param_num][motor_num]);
              g_Pf[param_num][motor_num] = NULL;
            }
            yprintf(OUTPUT_LV_DEBUG, "%d %s[%d] %f\n", param_num, param_names[param_num], motor_num,
                    g_P[param_num][motor_num]);
          }
          param_num = YP_PARAM_NUM;
          read_state = 0;
          str_wp = 0;
          break;
        }
        else
        {
          value_str[str_wp] = c;
          str_wp++;
        }
        break;
      case 5: /* value */
        if (c == '#' || c == '\n')
        {
          value_str[str_wp] = 0;
          str_wp = 0;
          if (param_num == YP_PARAM_NUM)
          {
            yprintf(OUTPUT_LV_ERROR, "Error: Invalid parameter -- '%s'.\n", name);
            param_error = 1;
          }
          else if (motor_num == -1)
          {
            int j;
            for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
            {
              g_P[param_num][j] = 0;
              g_P_set[param_num][j] = 1;
              if (g_Pf[param_num][j])
                formula_free(g_Pf[param_num][j]);
              formula(value_str, &g_Pf[param_num][j], variables);
            }
            if (g_Pf[param_num][0] == NULL)
            {
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid formula -- '%s'.\n", value_str);
              param_error = 1;
            }
            else
            {
              for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
              {
                g_Pf[param_num][j] = formula_optimize(g_Pf[param_num][j]);
              }
              yprintf(OUTPUT_LV_DEBUG, "%d %s ", param_num, param_names[param_num]);
              if (output_lv() >= OUTPUT_LV_DEBUG)
                formula_print(stderr, g_Pf[param_num][0]);
              yprintf(OUTPUT_LV_DEBUG, "\n");
            }
          }
          else
          {
            g_P[param_num][motor_num] = 0;
            g_P_set[param_num][motor_num] = 1;
            if (g_Pf[param_num][motor_num])
              formula_free(g_Pf[param_num][motor_num]);
            formula(value_str, &g_Pf[param_num][motor_num], variables);
            if (g_Pf[param_num][motor_num] == NULL)
            {
              yprintf(OUTPUT_LV_ERROR, "Error: Invalid formula -- '%s'.\n", value_str);
              param_error = 1;
            }
            else
            {
              g_Pf[param_num][motor_num] = formula_optimize(g_Pf[param_num][motor_num]);
              yprintf(OUTPUT_LV_DEBUG, "%d %s[%d] ", param_num, param_names[param_num], motor_num);
              if (output_lv() >= OUTPUT_LV_DEBUG)
                formula_print(stderr, g_Pf[param_num][motor_num]);
              yprintf(OUTPUT_LV_DEBUG, "\n");
            }
          }
          param_num = YP_PARAM_NUM;
          read_state = 0;
          str_wp = 0;
          break;
        }
        else
        {
          value_str[str_wp] = c;
          str_wp++;
        }
        break;
    }
    if (eof)
      break;
  }

  fclose(paramfile);
  if (g_P[YP_PARAM_VERSION][0] < YP_PARAM_REQUIRED_VERSION)
  {
    yprintf(OUTPUT_LV_ERROR, "Error: Your parameter file format is too old!\n");
    yprintf(OUTPUT_LV_ERROR, "Error: This program requires %3.1f.\n", YP_PARAM_REQUIRED_VERSION);
    return 0;
  }
  if (g_P[YP_PARAM_VERSION][0] > YP_PARAM_SUPPORTED_VERSION)
  {
    yprintf(OUTPUT_LV_ERROR, "Error: Your parameter file format is unsupported!\n");
    yprintf(OUTPUT_LV_ERROR, "Error: Please install newer version of YP-Spur.\n");
    yprintf(OUTPUT_LV_ERROR, "Error: This program supports %3.1f.\n", YP_PARAM_SUPPORTED_VERSION);
    return 0;
  }

  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
    {
      if (!g_param.motor_enable[j])
        continue;
      if (param_necessary[i] && !g_P_set[i][j])
      {
        yprintf(OUTPUT_LV_ERROR, "Error: %s[%d] undefined!\n", param_names[i], j);
        param_error = 1;
      }
    }
  }
  if (param_error)
  {
    return 0;
  }

  g_param.num_motor_enable = 0;
  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    // Count motor number
    if (g_param.motor_enable[j])
      g_param.num_motor_enable++;
  }
  if (g_param.num_motor_enable == 0)
  {
    // If all parameters are common among motors, treat num_motor_enable as two
    g_param.motor_enable[0] = g_param.motor_enable[1] = 1;
    g_param.num_motor_enable = 2;
  }

  for (j = 0; j < YP_PARAM_MAX_MOTOR_NUM; j++)
  {
    if (!g_param.motor_enable[j])
      continue;

    // Verify parameter version compatibility
    if (g_P_changed[YP_PARAM_ENCODER_DENOMINATOR][j] &&
        g_P_set[YP_PARAM_ENCODER_DENOMINATOR][j])
    {
      if (g_P[YP_PARAM_VERSION][0] < 5.0)
      {
        yprintf(
            OUTPUT_LV_ERROR,
            "ERROR: Using ENCODER_DENOMINATOR requires parameter version >= 5.0.\n"
            " Please make sure that all other motor parameters are based on mechanical motor revolution instead of electrical.\n");
        return 0;
      }
      yprintf(
          OUTPUT_LV_WARNING,
          "Warn: ENCODER_DENOMINATOR parameter support is experimental.\n"
          " The behavior of this parameter may be changed in the future update.\n");
    }

    // Check and fill undefined parameters
    if (!g_P_set[YP_PARAM_TORQUE_LIMIT][j])
    {
      yprintf(OUTPUT_LV_WARNING, "Warn: TORQUE_LIMIT[%d] undefined. TORQUE_MAX[%d] will be used.\n", j, j);
      g_P[YP_PARAM_TORQUE_LIMIT][j] = g_P[YP_PARAM_TORQUE_MAX][j];
      g_P_changed[YP_PARAM_TORQUE_LIMIT][j] = ischanged_p(YP_PARAM_TORQUE_MAX, j);
    }

    if (!g_P_set[YP_PARAM_VEHICLE_CONTROL][j])
    {
      double default_value;
      if (j < 2)
        default_value = 1.0;
      else
        default_value = 0.0;

      if (g_P[YP_PARAM_VEHICLE_CONTROL][j] != default_value)
        g_P_changed[YP_PARAM_VEHICLE_CONTROL][j] = 1;
      g_P[YP_PARAM_VEHICLE_CONTROL][j] = default_value;
    }

    if (!g_P_set[YP_PARAM_ENCODER_TYPE][j])
    {
      if (g_P[YP_PARAM_ENCODER_TYPE][j] != 2.0)
        g_P_changed[YP_PARAM_ENCODER_TYPE][j] = 1;
      g_P[YP_PARAM_ENCODER_TYPE][j] = 2.0;
    }
    if (!g_P_set[YP_PARAM_INDEX_GEAR][j])
    {
      if (g_P[YP_PARAM_INDEX_GEAR][j] != 1.0)
        g_P_changed[YP_PARAM_INDEX_GEAR][j] = 1;
      g_P[YP_PARAM_INDEX_GEAR][j] = 1.0;
    }
    if (!g_P_set[YP_PARAM_ENCODER_DENOMINATOR][j])
    {
      if (g_P[YP_PARAM_ENCODER_DENOMINATOR][j] != 1.0)
        g_P_changed[YP_PARAM_ENCODER_DENOMINATOR][j] = 1;
      g_P[YP_PARAM_ENCODER_DENOMINATOR][j] = 1.0;
    }
    if (!g_P_set[YP_PARAM_DEVICE_TIMEOUT][j])
    {
      // YP_PARAM_DEVICE_TIMEOUT is always sent on reloading.
      // g_P_changed is not needed to be marked.
      g_P[YP_PARAM_DEVICE_TIMEOUT][j] = 0.3;
    }

    // Process internally calculated parameters
    g_P[YP_PARAM_TORQUE_UNIT][j] = 1.0 / g_P[YP_PARAM_TORQUE_FINENESS][j];
    g_P_changed[YP_PARAM_TORQUE_UNIT][j] = ischanged_p(YP_PARAM_TORQUE_FINENESS, j);
  }

  if (g_P_set[YP_PARAM_MAX_TIME_JUMP][0])
  {
    if (g_P[YP_PARAM_MAX_TIME_JUMP][0] <= 0)
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR: MAX_TIME_JUMP must be > 0.0.\n");
      param_error = 1;
    }
  }
  else
  {
    g_P[YP_PARAM_MAX_TIME_JUMP][0] = g_P[YP_PARAM_CONTROL_CYCLE][0];
  }
  if (g_P_set[YP_PARAM_MAX_TIME_JUMP_NEG][0])
  {
    if (g_P[YP_PARAM_MAX_TIME_JUMP_NEG][0] <= 0)
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR: -MAX_TIME_JUMP must be > 0.0.\n");
      param_error = 1;
    }
  }
  else
  {
    g_P[YP_PARAM_MAX_TIME_JUMP_NEG][0] = g_P[YP_PARAM_CONTROL_CYCLE][0];
  }

  if (param_error)
  {
    return 0;
  }

  // パラメータの指定によって自動的に求まるパラメータの計算
  calc_param_inertia2ff();

  /* パラメータを有効にする */
  enable_state(YP_STATE_MOTOR);
  enable_state(YP_STATE_VELOCITY);
  enable_state(YP_STATE_BODY);
  enable_state(YP_STATE_TRACKING);

  yprintf(OUTPUT_LV_DEBUG, "Info: %d motors defined\n", g_param.num_motor_enable);

  return 1;
}